

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_info_Test::TestBody(BuilderTest_build_info_Test *this)

{
  Builder<prometheus::Info> *pBVar1;
  Family<prometheus::Info> *this_00;
  Builder<prometheus::Info> local_88;
  Family<prometheus::Info> *local_18;
  Family<prometheus::Info> *family;
  BuilderTest_build_info_Test *this_local;
  
  family = (Family<prometheus::Info> *)this;
  BuildInfo();
  pBVar1 = detail::Builder<prometheus::Info>::Name(&local_88,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Info>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Info>::Labels(pBVar1,&(this->super_BuilderTest).const_labels)
  ;
  this_00 = detail::Builder<prometheus::Info>::Register(pBVar1,&(this->super_BuilderTest).registry);
  detail::Builder<prometheus::Info>::~Builder(&local_88);
  local_18 = this_00;
  Family<prometheus::Info>::Add<>(this_00,&(this->super_BuilderTest).more_labels);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_info) {
  auto& family =
      BuildInfo().Name(name).Help(help).Labels(const_labels).Register(registry);
  family.Add(more_labels);

  verifyCollectedLabels();
}